

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *strPair)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  
  bVar2 = *p;
  while (-1 < (char)bVar2) {
    iVar3 = isspace((uint)bVar2);
    if (iVar3 == 0) break;
    pbVar1 = (byte *)(p + 1);
    p = p + 1;
    bVar2 = *pbVar1;
  }
  if (*p == '/') {
    this->_closingType = 2;
    p = p + 1;
  }
  pcVar4 = StrPair::ParseName(&(this->super_XMLNode)._value,p);
  if ((this->super_XMLNode)._value._start == (this->super_XMLNode)._value._end) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = ParseAttributes(this,pcVar4);
    if (((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) && (this->_closingType == 0)) {
      pcVar4 = XMLNode::ParseDeep(&this->super_XMLNode,pcVar4,strPair);
      return pcVar4;
    }
  }
  return pcVar4;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* strPair )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p );
    if ( !p || !*p || _closingType ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, strPair );
    return p;
}